

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

QList<QSslCertificate> * __thiscall
QList<QSslCertificate>::operator+=(QList<QSslCertificate> *this,QList<QSslCertificate> *l)

{
  Data *pDVar1;
  QSslCertificate *pQVar2;
  QSslCertificate *pQVar3;
  QSslCertificatePrivate *pQVar4;
  QSslCertificate *pQVar5;
  long lVar6;
  
  lVar6 = (l->d).size;
  if (lVar6 != 0) {
    pDVar1 = (l->d).d;
    if ((pDVar1 == (Data *)0x0) ||
       (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      pQVar2 = (l->d).ptr;
      QtPrivate::QCommonArrayOps<QSslCertificate>::growAppend
                ((QCommonArrayOps<QSslCertificate> *)this,pQVar2,pQVar2 + lVar6);
    }
    else {
      QArrayDataPointer<QSslCertificate>::detachAndGrow
                (&this->d,GrowsAtEnd,lVar6,(QSslCertificate **)0x0,
                 (QArrayDataPointer<QSslCertificate> *)0x0);
      lVar6 = (l->d).size;
      if ((lVar6 != 0) && (0 < lVar6)) {
        pQVar5 = (l->d).ptr;
        pQVar2 = pQVar5 + lVar6;
        pQVar3 = (this->d).ptr;
        lVar6 = (this->d).size;
        do {
          pQVar4 = (pQVar5->d).d.ptr;
          (pQVar5->d).d.ptr = (QSslCertificatePrivate *)0x0;
          pQVar3[lVar6].d.d.ptr = pQVar4;
          pQVar5 = pQVar5 + 1;
          lVar6 = (this->d).size + 1;
          (this->d).size = lVar6;
        } while (pQVar5 < pQVar2);
      }
    }
  }
  return this;
}

Assistant:

QList<T> &operator+=(QList<T> &&l) { append(std::move(l)); return *this; }